

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O0

PossibleContents * __thiscall
wasm::PossibleContents::getTupleItem
          (PossibleContents *__return_storage_ptr__,PossibleContents *this,Index i)

{
  bool bVar1;
  add_pointer_t<wasm::Literal> ptVar2;
  add_pointer_t<wasm::PossibleContents::GlobalInfo> ptVar3;
  add_pointer_t<wasm::PossibleContents::ConeType> ptVar4;
  Type *pTVar5;
  type *cone;
  Type type;
  Index i_local;
  PossibleContents *this_local;
  
  type.id._4_4_ = i;
  cone = (type *)getType(this);
  bVar1 = wasm::Type::isTuple((Type *)&cone);
  if (!bVar1) {
    __assert_fail("type.isTuple()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                  ,0x146,"PossibleContents wasm::PossibleContents::getTupleItem(Index)");
  }
  ptVar2 = std::
           get_if<wasm::Literal,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                     (&this->value);
  if (ptVar2 != (add_pointer_t<wasm::Literal>)0x0) {
    handle_unreachable("TODO: use Literals",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                       ,0x148);
  }
  ptVar3 = std::
           get_if<wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                     (&this->value);
  if (ptVar3 != (add_pointer_t<wasm::PossibleContents::GlobalInfo>)0x0) {
    handle_unreachable("TODO",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                       ,0x14a);
  }
  ptVar4 = std::
           get_if<wasm::PossibleContents::ConeType,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                     (&this->value);
  if (ptVar4 != (add_pointer_t<wasm::PossibleContents::ConeType>)0x0) {
    if (ptVar4->depth == 0) {
      pTVar5 = wasm::Type::operator[]((Type *)&cone,(ulong)type.id._4_4_);
      fullConeType(__return_storage_ptr__,(Type)pTVar5->id);
      return __return_storage_ptr__;
    }
    __assert_fail("cone->depth == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                  ,0x14f,"PossibleContents wasm::PossibleContents::getTupleItem(Index)");
  }
  handle_unreachable("not a tuple",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                     ,0x152);
}

Assistant:

PossibleContents getTupleItem(Index i) {
    auto type = getType();
    assert(type.isTuple());
    if (std::get_if<Literal>(&value)) {
      WASM_UNREACHABLE("TODO: use Literals");
    } else if (std::get_if<GlobalInfo>(&value)) {
      WASM_UNREACHABLE("TODO");
    } else if (auto* cone = std::get_if<ConeType>(&value)) {
      // Return a full cone of the appropriate type, as we lack depth info for
      // the separate items in the tuple (tuples themselves have no subtyping,
      // so the tuple's depth must be 0, i.e., an exact type).
      assert(cone->depth == 0);
      return fullConeType(type[i]);
    } else {
      WASM_UNREACHABLE("not a tuple");
    }
  }